

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

void free_codes(archive_read *a)

{
  void *pvVar1;
  
  pvVar1 = a->format->data;
  free(*(void **)((long)pvVar1 + 0x118));
  free(*(void **)((long)pvVar1 + 0x140));
  free(*(void **)((long)pvVar1 + 0x168));
  free(*(void **)((long)pvVar1 + 400));
  free(*(void **)((long)pvVar1 + 0x138));
  free(*(void **)((long)pvVar1 + 0x160));
  free(*(void **)((long)pvVar1 + 0x188));
  free(*(void **)((long)pvVar1 + 0x1b0));
  memset((void *)((long)pvVar1 + 0x118),0,0xa0);
  return;
}

Assistant:

static void
free_codes(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  free(rar->maincode.tree);
  free(rar->offsetcode.tree);
  free(rar->lowoffsetcode.tree);
  free(rar->lengthcode.tree);
  free(rar->maincode.table);
  free(rar->offsetcode.table);
  free(rar->lowoffsetcode.table);
  free(rar->lengthcode.table);
  memset(&rar->maincode, 0, sizeof(rar->maincode));
  memset(&rar->offsetcode, 0, sizeof(rar->offsetcode));
  memset(&rar->lowoffsetcode, 0, sizeof(rar->lowoffsetcode));
  memset(&rar->lengthcode, 0, sizeof(rar->lengthcode));
}